

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

bool __thiscall duckdb::AsOfProbeBuffer::HasMoreData(AsOfProbeBuffer *this)

{
  pointer this_00;
  idx_t iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->fetch_next_left == true) {
    if ((this->lhs_scanner).
        super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
        super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
        .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl ==
        (PayloadScanner *)0x0) {
      return false;
    }
    this_00 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
              ::operator->(&this->lhs_scanner);
    iVar1 = PayloadScanner::Remaining(this_00);
    bVar2 = iVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool HasMoreData() const {
		return !fetch_next_left || (lhs_scanner && lhs_scanner->Remaining());
	}